

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O3

RC __thiscall PF_BufferMgr::FlushPages(PF_BufferMgr *this,int fd)

{
  PF_BufPageDesc *pPVar1;
  int iVar2;
  RC RVar3;
  PF_BufPageDesc *pPVar4;
  int slot;
  RC RVar5;
  
  RVar5 = 0;
  StatisticsMgr::Register(pStatisticsMgr,PF_FLUSHPAGES,STAT_ADDONE,(int *)0x0);
  if (this->first != -1) {
    pPVar4 = this->bufTable;
    RVar5 = 0;
    slot = this->first;
    do {
      iVar2 = pPVar4[slot].next;
      if (pPVar4[slot].fd == fd) {
        pPVar1 = pPVar4 + slot;
        if (pPVar1->pinCount == 0) {
          if (pPVar1->bDirty != 0) {
            RVar3 = WritePage(this,fd,pPVar1->pageNum,pPVar1->pData);
            if (RVar3 != 0) {
              return RVar3;
            }
            pPVar4 = this->bufTable;
            pPVar4[slot].bDirty = 0;
          }
          RVar3 = PF_HashTable::Delete(&this->hashTable,fd,pPVar4[slot].pageNum);
          if (RVar3 != 0) {
            return RVar3;
          }
          Unlink(this,slot);
          pPVar4 = this->bufTable;
          pPVar4[slot].next = this->free;
          this->free = slot;
        }
        else {
          RVar5 = 1;
        }
      }
      slot = iVar2;
    } while (iVar2 != -1);
  }
  return RVar5;
}

Assistant:

RC PF_BufferMgr::FlushPages(int fd)
{
   RC rc, rcWarn = 0;  // return codes

#ifdef PF_LOG
   char psMessage[100];
   sprintf (psMessage, "Flushing all pages for (%d).\n", fd);
   WriteLog(psMessage);
#endif

#ifdef PF_STATS
   pStatisticsMgr->Register(PF_FLUSHPAGES, STAT_ADDONE);
#endif

   // Do a linear scan of the buffer to find pages belonging to the file
   int slot = first;
   while (slot != INVALID_SLOT) {

      int next = bufTable[slot].next;

      // If the page belongs to the passed-in file descriptor
      if (bufTable[slot].fd == fd) {

#ifdef PF_LOG
 sprintf (psMessage, "Page (%d) is in buffer manager.\n", bufTable[slot].pageNum);
 WriteLog(psMessage);
#endif
         // Ensure the page is not pinned
         if (bufTable[slot].pinCount) {
            rcWarn = PF_PAGEPINNED;
         }
         else {
            // Write the page if dirty
            if (bufTable[slot].bDirty) {
#ifdef PF_LOG
 sprintf (psMessage, "Page (%d) is dirty\n",bufTable[slot].pageNum);
 WriteLog(psMessage);
#endif
               if ((rc = WritePage(fd, bufTable[slot].pageNum, bufTable[slot].pData)))
                  return (rc);
               bufTable[slot].bDirty = FALSE;
            }

            // Remove page from the hash table and add the slot to the free list
            if ((rc = hashTable.Delete(fd, bufTable[slot].pageNum)) ||
                  (rc = Unlink(slot)) ||
                  (rc = InsertFree(slot)))
               return (rc);
         }
      }
      slot = next;
   }

#ifdef PF_LOG
   WriteLog("All necessary pages flushed.\n");
#endif

   // Return warning or ok
   return (rcWarn);
}